

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintTo<char16_t,std::char_traits<char16_t>>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *value,iu_ostream *os)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> str;
  char16_t *local_58 [2];
  long local_48 [2];
  string local_38;
  
  local_58[0] = (char16_t *)local_48;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)local_58,value->_M_str,value->_M_str + value->_M_len);
  ShowAnyCString<char16_t>(&local_38,local_58[0]);
  iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(&local_38,os);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != (char16_t *)local_48) {
    operator_delete(local_58[0],local_48[0] * 2 + 2);
  }
  return;
}

Assistant:

inline void PrintTo(const ::std::basic_string_view<CharT, Traits>& value, iu_ostream* os)
{
    const ::std::basic_string<CharT, Traits> str{ value };
    UniversalTersePrint(str.c_str(), os);
}